

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_Recoil(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  double this;
  bool bVar1;
  bool local_4b;
  TAngle<double> local_48;
  VMValue *local_40;
  double xyvel;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc01,
                  "int AF_AActor_A_Recoil(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar1) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc01,
                  "int AF_AActor_A_Recoil(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  xyvel = (param->field_0).f;
  local_4b = true;
  if ((DObject *)xyvel != (DObject *)0x0) {
    local_4b = DObject::IsKindOf((DObject *)xyvel,AActor::RegistrationInfo.MyClass);
  }
  this = xyvel;
  if (local_4b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc01,
                  "int AF_AActor_A_Recoil(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc02,
                  "int AF_AActor_A_Recoil(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((char)defaultparam_local[(int)self].Count != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xc02,
                  "int AF_AActor_A_Recoil(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  local_40 = defaultparam_local[(int)self].Array;
  TAngle<double>::operator+(&local_48,180.0);
  AActor::Thrust((AActor *)this,&local_48,(double)local_40);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Recoil)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(xyvel);

	self->Thrust(self->Angles.Yaw + 180., xyvel);
	return 0;
}